

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

KFIXED<char,_(unsigned_char)__x03_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator[]
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *pLStack_18;
  KUINT16 i_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this_local;
  
  if (i == 0) {
    this_local = (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *)&this->m_X;
  }
  else if (i == 1) {
    this_local = (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *)&this->m_Y;
  }
  else {
    if (i != 2) {
      local_1a = i;
      pLStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *)&this->m_Z;
  }
  return (KFIXED<char,_(unsigned_char)__x03_> *)this_local;
}

Assistant:

const Type &LE_Vector<Type>::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_X;
    case 1:
        return m_Y;
    case 2:
        return m_Z;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}